

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_node::insert_move_after(xml_node *this,xml_node *moved,xml_node *node)

{
  bool bVar1;
  xml_allocator *this_00;
  xml_document_struct *pxVar2;
  xml_allocator *alloc;
  xml_node *node_local;
  xml_node *moved_local;
  xml_node *this_local;
  
  bVar1 = impl::anon_unknown_0::allow_move((xml_node)this->_root,(xml_node)moved->_root);
  if (bVar1) {
    if ((node->_root == (xml_node_struct *)0x0) || (node->_root->parent != this->_root)) {
      xml_node((xml_node *)&this_local);
    }
    else if (moved->_root == node->_root) {
      xml_node((xml_node *)&this_local);
    }
    else {
      this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(this->_root);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
      if (bVar1) {
        pxVar2 = impl::anon_unknown_0::get_document<pugi::xml_node_struct>(this->_root);
        (pxVar2->super_xml_node_struct).header = (pxVar2->super_xml_node_struct).header | 0x40;
        impl::anon_unknown_0::remove_node(moved->_root);
        impl::anon_unknown_0::insert_node_after(moved->_root,node->_root);
        this_local = (xml_node *)moved->_root;
      }
      else {
        xml_node((xml_node *)&this_local);
      }
    }
  }
  else {
    xml_node((xml_node *)&this_local);
  }
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI__FN xml_node xml_node::insert_move_after(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::insert_node_after(moved._root, node._root);

		return moved;
	}